

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall
TimerTest_scopedWithIterations_Test::TimerTest_scopedWithIterations_Test
          (TimerTest_scopedWithIterations_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a0798;
  return;
}

Assistant:

TEST(TimerTest, scopedWithIterations) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	timer timer_obj{ period, total_iterations, [&iterations, &promise]([[maybe_unused]] timer& in_timer) {
		if (++iterations == total_iterations) {
			promise.set_value();
		}
	} };

	EXPECT_EQ(promise.get_future().wait_for(timeout), std::future_status::ready);
}